

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O1

bool __thiscall
sptk::ScalarOperation::Run(ScalarOperation *this,double *number,bool *is_magic_number)

{
  char cVar1;
  int iVar2;
  pointer ppMVar3;
  bool bVar4;
  
  if (is_magic_number == (bool *)0x0 || number == (double *)0x0) {
    bVar4 = false;
  }
  else {
    *is_magic_number = false;
    ppMVar3 = (this->modules_).
              super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = ppMVar3 ==
            (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar4) {
      iVar2 = (*(*ppMVar3)->_vptr_ModuleInterface[2])(*ppMVar3,number,is_magic_number);
      cVar1 = (char)iVar2;
      while (cVar1 != '\0') {
        ppMVar3 = ppMVar3 + 1;
        bVar4 = ppMVar3 ==
                (this->modules_).
                super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar4) {
          return bVar4;
        }
        iVar2 = (*(*ppMVar3)->_vptr_ModuleInterface[2])(*ppMVar3,number,is_magic_number);
        cVar1 = (char)iVar2;
      }
    }
  }
  return bVar4;
}

Assistant:

bool ScalarOperation::Run(double* number, bool* is_magic_number) const {
  if (NULL == number || NULL == is_magic_number) {
    return false;
  }

  *is_magic_number = false;
  for (std::vector<ScalarOperation::ModuleInterface*>::const_iterator itr(
           modules_.begin());
       itr != modules_.end(); ++itr) {
    if (!(*itr)->Run(number, is_magic_number)) {
      return false;
    }
  }

  return true;
}